

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Type * __thiscall
soul::AST::BinaryOperator::getResultType(Type *__return_storage_ptr__,BinaryOperator *this)

{
  resolveOpTypes(this);
  Type::Type(__return_storage_ptr__,&(this->resolvedOpTypes).resultType);
  return __return_storage_ptr__;
}

Assistant:

Type getResultType() const override         { resolveOpTypes(); return resolvedOpTypes.resultType; }